

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.cpp
# Opt level: O2

int os_pushresult(lua_State *L,int i,char *filename)

{
  int *piVar1;
  char *pcVar2;
  int iVar3;
  
  if (i == 0) {
    piVar1 = __errno_location();
    iVar3 = *piVar1;
    lua_pushnil(L);
    pcVar2 = strerror(iVar3);
    lua_pushfstring(L,"%s: %s",filename,pcVar2);
    lua_pushinteger(L,(long)iVar3);
    iVar3 = 3;
  }
  else {
    iVar3 = 1;
    lua_pushboolean(L,1);
  }
  return iVar3;
}

Assistant:

static int os_pushresult (lua_State *L, int i, const char *filename) {
  int en = errno;  /* calls to Lua API may change this value */
  if (i) {
    lua_pushboolean(L, 1);
    return 1;
  }
  else {
    lua_pushnil(L);
    lua_pushfstring(L, "%s: %s", filename, strerror(en));
    lua_pushinteger(L, en);
    return 3;
  }
}